

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ForwardTypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ForwardTypeRestrictionSyntax*&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ForwardTypeRestrictionSyntax **args_2,Token *args_3,Token *args_4)

{
  Info *pIVar1;
  ForwardTypeRestrictionSyntax *pFVar2;
  size_t sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  SyntaxNode *pSVar7;
  undefined4 uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  ForwardTypedefDeclarationSyntax *pFVar21;
  long lVar22;
  
  pFVar21 = (ForwardTypedefDeclarationSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForwardTypedefDeclarationSyntax *)this->endPtr < pFVar21 + 1) {
    pFVar21 = (ForwardTypedefDeclarationSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pFVar21 + 1);
  }
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar1 = args_1->info;
  pFVar2 = *args_2;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar17 = args_4->kind;
  uVar18 = args_4->field_0x2;
  NVar19.raw = (args_4->numFlags).raw;
  uVar20 = args_4->rawLen;
  pIVar6 = args_4->info;
  (pFVar21->super_MemberSyntax).super_SyntaxNode.kind = ForwardTypedefDeclaration;
  (pFVar21->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pFVar21->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar8 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar7 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pFVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pFVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8
  ;
  (pFVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar7;
  (pFVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pFVar21->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (pFVar21->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pFVar21->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pFVar21->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pFVar21->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c7a10;
  (pFVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pFVar21;
  sVar3 = (pFVar21->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar3 != 0) {
    ppAVar4 = (pFVar21->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar22 = 0;
    do {
      *(ForwardTypedefDeclarationSyntax **)(*(long *)((long)ppAVar4 + lVar22) + 8) = pFVar21;
      lVar22 = lVar22 + 8;
    } while (sVar3 << 3 != lVar22);
  }
  (pFVar21->typedefKeyword).kind = TVar9;
  (pFVar21->typedefKeyword).field_0x2 = uVar10;
  (pFVar21->typedefKeyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pFVar21->typedefKeyword).rawLen = uVar12;
  (pFVar21->typedefKeyword).info = pIVar1;
  pFVar21->typeRestriction = pFVar2;
  (pFVar21->name).kind = TVar13;
  (pFVar21->name).field_0x2 = uVar14;
  (pFVar21->name).numFlags = (NumericTokenFlags)NVar15.raw;
  (pFVar21->name).rawLen = uVar16;
  (pFVar21->name).info = pIVar5;
  (pFVar21->semi).kind = TVar17;
  (pFVar21->semi).field_0x2 = uVar18;
  (pFVar21->semi).numFlags = (NumericTokenFlags)NVar19.raw;
  (pFVar21->semi).rawLen = uVar20;
  (pFVar21->semi).info = pIVar6;
  if (pFVar2 != (ForwardTypeRestrictionSyntax *)0x0) {
    (pFVar2->super_SyntaxNode).parent = (SyntaxNode *)pFVar21;
  }
  return pFVar21;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }